

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int tls_cbc_digest_record_sha256
              (uint8_t *md_out,size_t *md_out_size,uint8_t *header,uint8_t *data,size_t data_size,
              size_t data_plus_mac_plus_padding_size,uint8_t *mac_secret,uint mac_secret_length)

{
  int iVar1;
  ulong local_130;
  size_t i_1;
  uint8_t mac_out [32];
  size_t min_data_size;
  SHA256_CTX ctx;
  size_t i;
  uint8_t hmac_pad [64];
  size_t data_plus_mac_plus_padding_size_local;
  size_t data_size_local;
  uint8_t *data_local;
  uint8_t *header_local;
  size_t *md_out_size_local;
  uint8_t *md_out_local;
  
  if (0x40 < mac_secret_length) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x192,
                  "int tls_cbc_digest_record_sha256(uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                 );
  }
  OPENSSL_memset(&i,0,0x40);
  OPENSSL_memcpy(&i,mac_secret,(ulong)mac_secret_length);
  ctx.num = 0;
  ctx.md_len = 0;
  for (; (ulong)ctx._104_8_ < 0x40; ctx._104_8_ = ctx._104_8_ + 1) {
    hmac_pad[ctx._104_8_ + -8] = hmac_pad[ctx._104_8_ + -8] ^ 0x36;
  }
  SHA256_Init((SHA256_CTX *)&min_data_size);
  SHA256_Update((SHA256_CTX *)&min_data_size,&i,0x40);
  SHA256_Update((SHA256_CTX *)&min_data_size,header,0xd);
  mac_out[0x18] = '\0';
  mac_out[0x19] = '\0';
  mac_out[0x1a] = '\0';
  mac_out[0x1b] = '\0';
  mac_out[0x1c] = '\0';
  mac_out[0x1d] = '\0';
  mac_out[0x1e] = '\0';
  mac_out[0x1f] = '\0';
  if (0x120 < data_plus_mac_plus_padding_size) {
    mac_out._24_8_ = data_plus_mac_plus_padding_size - 0x120;
  }
  SHA256_Update((SHA256_CTX *)&min_data_size,data,mac_out._24_8_);
  iVar1 = EVP_sha256_final_with_secret_suffix
                    ((SHA256_CTX *)&min_data_size,(uint8_t *)&i_1,data + mac_out._24_8_,
                     data_size - mac_out._24_8_,data_plus_mac_plus_padding_size - mac_out._24_8_);
  if (iVar1 == 0) {
    md_out_local._4_4_ = 0;
  }
  else {
    SHA256_Init((SHA256_CTX *)&min_data_size);
    for (local_130 = 0; local_130 < 0x40; local_130 = local_130 + 1) {
      hmac_pad[local_130 - 8] = hmac_pad[local_130 - 8] ^ 0x6a;
    }
    SHA256_Update((SHA256_CTX *)&min_data_size,&i,0x40);
    SHA256_Update((SHA256_CTX *)&min_data_size,&i_1,0x20);
    SHA256_Final(md_out,(SHA256_CTX *)&min_data_size);
    *md_out_size = 0x20;
    md_out_local._4_4_ = 1;
  }
  return md_out_local._4_4_;
}

Assistant:

static int tls_cbc_digest_record_sha256(uint8_t *md_out, size_t *md_out_size,
                                        const uint8_t header[13],
                                        const uint8_t *data, size_t data_size,
                                        size_t data_plus_mac_plus_padding_size,
                                        const uint8_t *mac_secret,
                                        unsigned mac_secret_length) {
  if (mac_secret_length > SHA256_CBLOCK) {
    // HMAC pads small keys with zeros and hashes large keys down. This function
    // should never reach the large key case.
    assert(0);
    return 0;
  }

  // Compute the initial HMAC block.
  uint8_t hmac_pad[SHA256_CBLOCK];
  OPENSSL_memset(hmac_pad, 0, sizeof(hmac_pad));
  OPENSSL_memcpy(hmac_pad, mac_secret, mac_secret_length);
  for (size_t i = 0; i < SHA256_CBLOCK; i++) {
    hmac_pad[i] ^= 0x36;
  }

  SHA256_CTX ctx;
  SHA256_Init(&ctx);
  SHA256_Update(&ctx, hmac_pad, SHA256_CBLOCK);
  SHA256_Update(&ctx, header, 13);

  // There are at most 256 bytes of padding, so we can compute the public
  // minimum length for |data_size|.
  size_t min_data_size = 0;
  if (data_plus_mac_plus_padding_size > SHA256_DIGEST_LENGTH + 256) {
    min_data_size =
        data_plus_mac_plus_padding_size - SHA256_DIGEST_LENGTH - 256;
  }

  // Hash the public minimum length directly. This reduces the number of blocks
  // that must be computed in constant-time.
  SHA256_Update(&ctx, data, min_data_size);

  // Hash the remaining data without leaking |data_size|.
  uint8_t mac_out[SHA256_DIGEST_LENGTH];
  if (!EVP_sha256_final_with_secret_suffix(
          &ctx, mac_out, data + min_data_size, data_size - min_data_size,
          data_plus_mac_plus_padding_size - min_data_size)) {
    return 0;
  }

  // Complete the HMAC in the standard manner.
  SHA256_Init(&ctx);
  for (size_t i = 0; i < SHA256_CBLOCK; i++) {
    hmac_pad[i] ^= 0x6a;
  }

  SHA256_Update(&ctx, hmac_pad, SHA256_CBLOCK);
  SHA256_Update(&ctx, mac_out, SHA256_DIGEST_LENGTH);
  SHA256_Final(md_out, &ctx);
  *md_out_size = SHA256_DIGEST_LENGTH;
  return 1;
}